

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

void Nwk_ManIncrementTravId(Nwk_Man_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  int local_1c;
  int i;
  Nwk_Obj_t *pObj;
  Nwk_Man_t *pNtk_local;
  
  if (0x3fffffe < pNtk->nTravIds) {
    pNtk->nTravIds = 0;
    for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1)
    {
      pvVar2 = Vec_PtrEntry(pNtk->vObjs,local_1c);
      if (pvVar2 != (void *)0x0) {
        *(undefined4 *)((long)pvVar2 + 0x28) = 0;
      }
    }
  }
  pNtk->nTravIds = pNtk->nTravIds + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Increments the current traversal ID of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Nwk_ManIncrementTravId( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int i;
    if ( pNtk->nTravIds >= (1<<26)-1 )
    {
        pNtk->nTravIds = 0;
        Nwk_ManForEachObj( pNtk, pObj, i )
            pObj->TravId = 0;
    }
    pNtk->nTravIds++;
}